

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O2

void __thiscall DecHeap::bubble_up(DecHeap *this,size_t idx)

{
  pointer ppVar1;
  ulong a;
  
  while ((idx != 0 &&
         (a = idx - 1 >> 1,
         ppVar1 = (this->heap).
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, ppVar1[idx].first < ppVar1[a].first)))
  {
    swap(this,a,idx);
    idx = a;
  }
  return;
}

Assistant:

void DecHeap::bubble_up(size_t idx) {
    while (idx && heap[(idx - 1)/2].first > heap[idx].first) {
        this->swap((idx - 1)/2, idx);
        idx = (idx - 1) / 2;
    }
}